

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O1

void conn_shutdown(conn_handle *conn)

{
  int *piVar1;
  
  piVar1 = (int *)conn->priv;
  mutex_lock_shared((mutex_handle *)(piVar1 + 0x24));
  if (piVar1[1] != -1) {
    shutdown(piVar1[1],2);
  }
  if (*piVar1 != -1) {
    shutdown(*piVar1,2);
  }
  mutex_unlock_shared((mutex_handle *)(piVar1 + 0x24));
  return;
}

Assistant:

void conn_shutdown(struct conn_handle *conn)
{
	struct conn_priv *priv = conn->priv;

	mutex_lock_shared(&priv->mutex);

	if (priv->conn_fd != INVALID_SOCKET)
		shutdown(priv->conn_fd, SHUT_RDWR);

	if (priv->sock_fd != INVALID_SOCKET) {
		shutdown(priv->sock_fd, SHUT_RDWR);
#if defined(_WIN32) || defined(__APPLE__)
		/*! @TODO Hack to cancel an in-progress accept */
		closesocket(priv->sock_fd);
		priv->sock_fd = INVALID_SOCKET;
#endif
	}

	mutex_unlock_shared(&priv->mutex);
}